

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perplexity.cpp
# Opt level: O2

bool decode_helper(llama_context *ctx,llama_batch *batch,
                  vector<float,_std::allocator<float>_> *batch_logits,int n_batch,int n_vocab)

{
  int iVar1;
  int8_t *piVar2;
  pointer pfVar3;
  uint uVar4;
  void *__src;
  common_log *log;
  long lVar5;
  int iVar6;
  long lVar7;
  undefined8 in_R9;
  ulong uVar8;
  int iVar9;
  int8_t *piVar10;
  undefined4 uStack_60;
  undefined4 local_58;
  undefined4 uStack_50;
  undefined4 local_48;
  undefined4 uStack_40;
  
  lVar7 = 0;
  uVar8 = 0;
  do {
    iVar1 = batch->n_tokens;
    if (iVar1 <= lVar7) {
LAB_00138cab:
      return iVar1 <= lVar7;
    }
    iVar6 = iVar1 - (int)lVar7;
    if (n_batch <= iVar6) {
      iVar6 = n_batch;
    }
    piVar2 = batch->logits;
    uStack_60 = SUB84(batch->token + lVar7,0);
    local_58 = 0;
    uStack_50 = SUB84(batch->pos + lVar7,0);
    local_48 = SUB84(batch->n_seq_id + lVar7,0);
    uStack_40 = SUB84(batch->seq_id + lVar7,0);
    iVar9 = iVar6;
    piVar10 = piVar2 + lVar7;
    uVar4 = llama_decode(ctx);
    if (uVar4 != 0) {
      if (-1 < common_log_verbosity_thold) {
        log = common_log_main();
        common_log_add(log,GGML_LOG_LEVEL_ERROR,
                       "failed to decode the batch, n_batch = %d, ret = %d\n",(ulong)(uint)n_batch,
                       (ulong)uVar4,in_R9,iVar9,uStack_60,local_58,uStack_50,local_48,uStack_40,
                       piVar10);
      }
      goto LAB_00138cab;
    }
    uVar4 = 0;
    for (lVar5 = 0; lVar5 < iVar6; lVar5 = lVar5 + 1) {
      uVar4 = (uVar4 + 1) - (uint)((piVar2 + lVar7)[lVar5] == '\0');
    }
    pfVar3 = (batch_logits->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __src = (void *)llama_get_logits(ctx);
    memcpy(pfVar3 + uVar8 * (long)n_vocab,__src,(ulong)uVar4 * (long)n_vocab * 4);
    uVar8 = (ulong)((int)uVar8 + uVar4);
    lVar7 = lVar7 + n_batch;
  } while( true );
}

Assistant:

static bool decode_helper(llama_context * ctx, llama_batch & batch, std::vector<float> & batch_logits, int n_batch, int n_vocab) {
    int prev_outputs = 0;
    for (int i = 0; i < (int) batch.n_tokens; i += n_batch) {
        const int n_tokens = std::min<int>(n_batch, batch.n_tokens - i);

        llama_batch batch_view = {
            n_tokens,
            batch.token    + i,
            nullptr,
            batch.pos      + i,
            batch.n_seq_id + i,
            batch.seq_id   + i,
            batch.logits   + i,
        };

        const int ret = llama_decode(ctx, batch_view);
        if (ret != 0) {
            LOG_ERR("failed to decode the batch, n_batch = %d, ret = %d\n", n_batch, ret);
            return false;
        }

        int n_outputs = 0;
        for (int i = 0; i < n_tokens; ++i) {
            n_outputs += batch_view.logits[i] != 0;
        }

        memcpy(batch_logits.data() + size_t(prev_outputs)*n_vocab, llama_get_logits(ctx), size_t(n_outputs)*n_vocab*sizeof(float));

        prev_outputs += n_outputs;
    }

    return true;
}